

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O3

void __thiscall miniros::TransportTCP::setNoDelay(TransportTCP *this,bool nodelay)

{
  int iVar1;
  undefined7 in_register_00000031;
  int flag;
  undefined4 local_3c;
  string local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000031,nodelay);
  iVar1 = setsockopt(this->sock_,6,1,&local_3c,4);
  if (iVar1 < 0) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (setNoDelay::loc.initialized_ == false) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"miniros.transport_tcp","");
      console::initializeLogLocation(&setNoDelay::loc,&local_38,Error);
      setNoDelay();
    }
    if (setNoDelay::loc.level_ != Error) {
      setNoDelay();
    }
    if (setNoDelay::loc.logger_enabled_ == true) {
      setNoDelay();
    }
  }
  return;
}

Assistant:

void TransportTCP::setNoDelay(bool nodelay)
{
  int flag = nodelay ? 1 : 0;
  int result = setsockopt(sock_, IPPROTO_TCP, TCP_NODELAY, (char *) &flag, sizeof(int));
  if (result < 0)
  {
    MINIROS_ERROR("setsockopt failed to set TCP_NODELAY on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
  }
}